

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

uint * __thiscall
CAPSFile::ExtractDensity
          (CAPSFile *this,uchar *buffer,int density_buf_size,uint ctype,uint cyl,uint head)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  char buff [128];
  char local_b8 [136];
  
  uVar6 = *(uint *)(buffer + 4);
  uVar8 = (uVar6 & 0xff0000) >> 8;
  uVar2 = (uVar6 & 0xff00) << 8;
  uVar11 = uVar6 >> 0x18 | uVar8 | uVar2 | uVar6 << 0x18;
  puVar4 = (uint *)operator_new__((ulong)(uVar6 >> 0x18 & 0xfffffffc | uVar8 | uVar2 | uVar6 << 0x18
                                         ));
  if (3 < uVar11) {
    uVar11 = uVar11 >> 2;
    puVar5 = puVar4 + uVar11;
    do {
      uVar12 = (ulong)(density_buf_size - 1);
      bVar1 = buffer[uVar12];
      switch(bVar1 & 3) {
      case 0:
        if ((bVar1 & 8) == 0) {
          iVar7 = (bVar1 >> 4) + 1;
        }
        else {
          uVar12 = (ulong)(density_buf_size - 2);
          iVar7 = CONCAT31((int3)(((uint)bVar1 << 4) >> 8),buffer[uVar12]);
        }
        uVar6 = (uint)uVar12;
        if ((bVar1 & 4) == 0) {
          for (; iVar7 != 0; iVar7 = iVar7 + -1) {
            uVar6 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar6;
            puVar5[-1] = (uint)buffer[uVar12];
            puVar5 = puVar5 + -1;
          }
        }
        else if (iVar7 != 0) {
          iVar10 = 0;
          lVar13 = 0;
          do {
            iVar3 = (int)lVar13;
            *(uint *)((long)puVar5 + lVar13 + -4) =
                 (uint)buffer[(uVar6 - 4) + iVar3] |
                 ((uint)buffer[(uVar6 - 3) + iVar3] |
                 (uint)buffer[(uVar6 - 2) + iVar3] << 8 | (uint)buffer[(uVar6 - 1) + iVar3] << 0x10)
                 << 8;
            lVar13 = lVar13 + -4;
            iVar10 = iVar10 + 4;
          } while (iVar7 << 2 != iVar10);
          puVar5 = (uint *)((long)puVar5 + lVar13);
          uVar6 = uVar6 - iVar10;
        }
        goto LAB_0012e6c3;
      case 1:
        uVar12 = (ulong)(density_buf_size - 2);
        uVar9 = (ulong)buffer[uVar12] + 1;
        break;
      case 2:
        uVar12 = (ulong)(density_buf_size - 3);
        uVar9 = (ulong)CONCAT11(buffer[density_buf_size - 2],buffer[uVar12]);
        break;
      case 3:
        uVar6 = density_buf_size - 4;
        uVar12 = (ulong)uVar6;
        uVar8 = (uint)buffer[density_buf_size - 2] | (bVar1 & 0xfc) << 6;
        if (uVar8 == 0) goto LAB_0012e6c3;
        uVar9 = (ulong)CONCAT11(buffer[density_buf_size - 3],buffer[uVar12]);
        goto LAB_0012e6b0;
      }
      uVar8 = (bVar1 >> 2) + 1;
LAB_0012e6b0:
      do {
        uVar6 = (uint)uVar12;
        puVar5[-1] = puVar5[uVar9 - 1];
        puVar5 = puVar5 + -1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
LAB_0012e6c3:
      density_buf_size = uVar6;
    } while (puVar4 < puVar5);
    if (cyl == 0x12) {
      uVar12 = 1;
      if (1 < uVar11) {
        uVar12 = (ulong)uVar11;
      }
      uVar9 = 0;
      do {
        if (puVar4[uVar9] - 0x11 < 0xfffffffc) {
          sprintf(local_b8," index = %i - Valeur = %2.2X ",uVar9 & 0xffffffff);
        }
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
  }
  return puVar4;
}

Assistant:

unsigned int* CAPSFile::ExtractDensity(unsigned char* buffer, int density_buf_size, DWORD ctype, DWORD cyl, DWORD head)
{
   unsigned int usize = ExtractInt(&buffer[4]);
   unsigned int ucrc = ExtractInt(&buffer[8]);; // CRC on uncompressed data
   unsigned int csize = ExtractInt(&buffer[12]);; // compressed size in bytes
   unsigned int ccrc = ExtractInt(&buffer[16]);; // CRC on compressed data
   unsigned int hcrc = ExtractInt(&buffer[20]);; // CRC on header calculated as hcrc=0

   // density
   unsigned int* buf = new unsigned int[usize >> 2];

   // Ptr to end of buffer
   unsigned int* mem = &buf[usize >> 2];
   unsigned int offset_source = density_buf_size;

   // Decode data :
   while (mem > buf)
   {
      int size, ofs = 0;
      unsigned char cb0 = buffer[--offset_source];

      switch (cb0 & 0x03)
      {
      case 0x0: // data block
         // 14 or 4 bit size
         if (cb0 & 0x8)
         {
            size = ((cb0 << 4) & 0xF00) | (buffer[--offset_source]);
         }
         else
         {
            size = (cb0 >> 4) + 1;
         }
         if (cb0 & 0x4)
         {
            // 4 byte per value
            while (size--)
            {
               unsigned int data;
               data = buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               *--mem = data;
            }
         }
         else
         {
            while (size--)
            {
               *--mem = buffer[--offset_source];
            }
         }
         continue;

      case 0x1: // copy block, 8bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source] + 1;
         break;
      case 0x2: // copy block, 16 bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      case 0x3: // Copy block, 16 bit offset, 14 bit size
         size = ((cb0 << 6) & 0x3F00) | buffer[--offset_source];
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      }

      while (size--)
      {
         mem--;
         *mem = mem[ofs];
      }
   }


   if (cyl == 0x12)
   {
      int nbDens = (usize >> 2);
      for (int i = 0; i < nbDens; i++)
      {
         if (buf[i] >= 0x11 || buf[i] <= 0x0C)
         {
            char buff[128];
            sprintf(buff, " index = %i - Valeur = %2.2X ", i, buf[i]);
            OutputDebugString (buff);
         }
      }
   }

   return buf;
}